

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.cpp
# Opt level: O0

void __thiscall ThreadPool::Run(ThreadPool *this,CallFunc *func)

{
  size_type sVar1;
  LockGuard local_20;
  LockGuard lock;
  CallFunc *func_local;
  ThreadPool *this_local;
  
  lock.m_mutex = (Mutex *)func;
  if ((this->m_bRunning & 1U) == 0) {
    std::function<void_()>::operator()(func);
  }
  else {
    LockGuard::LockGuard(&local_20,&this->m_mutex);
    while( true ) {
      sVar1 = std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::size
                        (&this->m_tasks);
      if (sVar1 < (ulong)(long)this->m_maxTaskNum) break;
      Condition::Wait(&this->m_notFull);
    }
    std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
              (&this->m_tasks,func);
    Condition::Notify(&this->m_notEmpty);
    LockGuard::~LockGuard(&local_20);
  }
  return;
}

Assistant:

void ThreadPool::Run(CallFunc func)
{
	if (!m_bRunning)
	{
		func();
	}
	else
	{
		LockGuard lock(m_mutex);
		while(m_tasks.size() >= m_maxTaskNum)
		{
			m_notFull.Wait();
		}
		
		m_tasks.push_back(func);
		m_notEmpty.Notify();
	}
}